

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-type.cpp
# Opt level: O2

Up __thiscall
yactfr::OptionalWithSignedIntegerSelectorType::_clone(OptionalWithSignedIntegerSelectorType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  undefined1 local_30 [8];
  undefined1 local_28 [16];
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_18;
  
  local_28._12_4_ = *(uint *)(in_RSI + 0x18);
  DataType::clone((DataType *)local_28,*(__fn **)(in_RSI + 0x20),in_RDX,in_ECX,in_R8);
  internal::tryCloneAttrs((MapItem *)local_30);
  std::
  make_unique<yactfr::OptionalWithSignedIntegerSelectorType_const,unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation_const&,yactfr::IntegerRangeSet<long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)&local_18,
             (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             (local_28 + 0xc),(DataLocation *)local_28,
             (IntegerRangeSet<long_long,_true> *)(in_RSI + 0x28),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x80));
  (this->super_OptionalWithIntegerSelectorType<long_long>).super_OptionalType.super_CompoundDataType
  .super_DataType._vptr_DataType =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_30);
  if ((_func_int **)local_28._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_28._0_8_ + 8))();
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up OptionalWithSignedIntegerSelectorType::_clone() const
{
    return OptionalWithSignedIntegerSelectorType::create(this->minimumAlignment(),
                                                         this->dataType().clone(),
                                                         this->selectorLocation(),
                                                         this->selectorRanges(),
                                                         internal::tryCloneAttrs(this->attributes()));
}